

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O2

bool __thiscall
dielectric::scatter(dielectric *this,ray *r_in,hit_record *rec,vec3 *attenuation,ray *scattered)

{
  double dVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  double dVar4;
  double dVar5;
  vec3 local_78 [2];
  vec3 local_40;
  
  attenuation->e[0] = 1.0;
  attenuation->e[1] = 1.0;
  attenuation->e[2] = 1.0;
  dVar5 = this->ref_idx;
  if (rec->front_face != false) {
    dVar5 = 1.0 / dVar5;
  }
  local_78[0].e[2] = (r_in->dir).e[2];
  local_78[0].e[0] = (r_in->dir).e[0];
  dVar4 = (r_in->dir).e[1];
  local_78[0].e[1] =
       1.0 / SQRT(local_78[0].e[2] * local_78[0].e[2] +
                  local_78[0].e[0] * local_78[0].e[0] + dVar4 * dVar4);
  local_78[0].e[2] = local_78[0].e[2] * local_78[0].e[1];
  local_78[0].e[0] = local_78[0].e[1] * local_78[0].e[0];
  local_78[0].e[1] = local_78[0].e[1] * dVar4;
  dVar4 = (-local_78[0].e[0] * (rec->normal).e[0] - local_78[0].e[1] * (rec->normal).e[1]) -
          local_78[0].e[2] * (rec->normal).e[2];
  if (1.0 <= dVar4) {
    dVar4 = 1.0;
  }
  dVar4 = 1.0 - dVar4 * dVar4;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  if (dVar4 * dVar5 <= 1.0) {
    refract(&local_40,local_78,&rec->normal,dVar5);
    uVar2 = SUB84(r_in->tm,0);
    uVar3 = (undefined4)((ulong)r_in->tm >> 0x20);
    dVar5 = (rec->p).e[2];
    dVar4 = (rec->p).e[0];
    dVar1 = (rec->p).e[1];
    (scattered->dir).e[1] = local_40.e[1];
    (scattered->dir).e[2] = local_40.e[2];
    (scattered->orig).e[2] = dVar5;
    (scattered->dir).e[0] = local_40.e[0];
    (scattered->orig).e[0] = dVar4;
    (scattered->orig).e[1] = dVar1;
  }
  else {
    reflect(&local_40,local_78,&rec->normal);
    dVar5 = (rec->p).e[2];
    dVar4 = (rec->p).e[0];
    dVar1 = (rec->p).e[1];
    (scattered->dir).e[1] = local_40.e[1];
    (scattered->dir).e[2] = local_40.e[2];
    (scattered->orig).e[0] = dVar4;
    (scattered->orig).e[1] = dVar1;
    (scattered->orig).e[2] = dVar5;
    (scattered->dir).e[0] = local_40.e[0];
    uVar2 = 0;
    uVar3 = 0;
  }
  scattered->tm = (double)CONCAT44(uVar3,uVar2);
  return true;
}

Assistant:

virtual bool scatter (
            const ray& r_in,const hit_record& rec,vec3& attenuation,ray& scattered
    ) const {
        double etai_over_etat;
        attenuation = vec3(1.0, 1.0, 1.0);

        if (rec.front_face) {
            etai_over_etat = 1 / ref_idx;
        } else {
            etai_over_etat = ref_idx;
        }

        vec3 unit_direction = unit_vector(r_in.direction());
        double cos_theta = ffmin(dot(-unit_direction, rec.normal), 1.0);
        double sin_theta = sqrt(1.0 - cos_theta * cos_theta);

        if (etai_over_etat * sin_theta > 1.0) {
            vec3 reflected = reflect(unit_direction, rec.normal);
            scattered = ray(rec.p, reflected);
            return true;
        }

        vec3 refracted = refract(unit_direction, rec.normal, etai_over_etat);
        scattered = ray(rec.p, refracted, r_in.time());

        return true;
    }